

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mesh.hpp
# Opt level: O2

HydroProp * __thiscall OpenMD::Mesh::getHydroProp(Mesh *this,RealType viscosity)

{
  HydroProp *this_00;
  Vector<double,_3U> VStack_28;
  
  this_00 = (HydroProp *)operator_new(0x280);
  HydroProp::HydroProp(this_00);
  Vector<double,_3U>::Vector(&VStack_28,(Vector<double,_3U> *)OpenMD::V3Zero);
  HydroProp::setCenterOfResistance(this_00,(Vector3d *)&VStack_28);
  builtin_strncpy(painCave.errMsg,"Mesh was asked to return an analytic HydroProps.\n",0x32);
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
  return this_00;
}

Assistant:

virtual HydroProp* getHydroProp(RealType viscosity) {
      HydroProp* props = new HydroProp();
      props->setCenterOfResistance(V3Zero);
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Mesh was asked to return an analytic HydroProps.\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
      return props;
    }